

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webclient.cpp
# Opt level: O1

size_t warhawk::common::string_write_cb(void *contents_,size_t size_,size_t nmemb_,void *userp_)

{
  size_t sVar1;
  long *local_38 [2];
  long local_28 [2];
  
  sVar1 = size_ * nmemb_;
  if (sVar1 == 0) {
    sVar1 = 0;
  }
  else {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,contents_,(void *)((long)contents_ + sVar1));
    std::__cxx11::string::_M_append((char *)userp_,(ulong)local_38[0]);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return sVar1;
}

Assistant:

static size_t string_write_cb( void *contents_, size_t size_, size_t nmemb_, void *userp_ )
{
  size_t realsize = size_ * nmemb_;

  if ( realsize == 0 )
  {
    return 0;
  }

  std::string* str = static_cast< std::string * >( userp_ );

  try
  {
    str->append( std::string( (const char *) contents_, realsize ) );
  }
  catch ( ... )
  {
    return 0;
  }

  return realsize;
}